

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2table.cpp
# Opt level: O2

int __thiscall QuantNet::get_conv_bottom_blob_names(QuantNet *this)

{
  string *__lhs;
  pointer ppLVar1;
  Layer *pLVar2;
  bool bVar3;
  mapped_type *pmVar4;
  ulong uVar5;
  string bottom_blob_name;
  string name;
  string local_70 [32];
  key_type local_50;
  
  uVar5 = 0;
  do {
    ppLVar1 = (this->super_Net).layers.
              super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->super_Net).layers.
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppLVar1 >> 3) <= uVar5) {
      return 0;
    }
    pLVar2 = ppLVar1[uVar5];
    __lhs = &pLVar2->type;
    bVar3 = std::operator==(__lhs,"Convolution");
    if (bVar3) {
LAB_001129f6:
      std::__cxx11::string::string((string *)&local_50,(string *)&pLVar2->name);
      std::__cxx11::string::string
                (local_70,(string *)
                          ((this->super_Net).blobs.
                           super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                           super__Vector_impl_data._M_start +
                          *(pLVar2->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start));
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->conv_bottom_blob_names,&local_50);
      std::__cxx11::string::_M_assign((string *)pmVar4);
      std::__cxx11::string::~string(local_70);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      bVar3 = std::operator==(__lhs,"ConvolutionDepthWise");
      if (bVar3) goto LAB_001129f6;
      bVar3 = std::operator==(__lhs,"InnerProduct");
      if (bVar3) goto LAB_001129f6;
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

int QuantNet::get_conv_bottom_blob_names()
{
    // find conv bottom name or index
    for (size_t i=0; i<layers.size(); i++)
    {
        ncnn::Layer* layer = layers[i];
        
        if (layer->type == "Convolution" || layer->type == "ConvolutionDepthWise" || layer->type == "InnerProduct")
        {
            std::string name = layer->name;
            std::string bottom_blob_name = blobs[layer->bottoms[0]].name;
            conv_bottom_blob_names[name] = bottom_blob_name;
        }
    }

    return 0;
}